

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier> *)
             _KNearestNeighborsClassifier_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NearestNeighborsIndex>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::NearestNeighborsIndex> *)
           _NearestNeighborsIndex_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::UniformWeighting>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::UniformWeighting> *)
           _UniformWeighting_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::InverseDistanceWeighting>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::InverseDistanceWeighting> *)
             _InverseDistanceWeighting_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinearIndex>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LinearIndex> *)
             _LinearIndex_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SingleKdTreeIndex>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SingleKdTreeIndex> *)
           _SingleKdTreeIndex_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SquaredEuclideanDistance>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::SquaredEuclideanDistance> *)
             _SquaredEuclideanDistance_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _KNearestNeighborsClassifier_default_instance_.Shutdown();
  _NearestNeighborsIndex_default_instance_.Shutdown();
  _UniformWeighting_default_instance_.Shutdown();
  _InverseDistanceWeighting_default_instance_.Shutdown();
  _LinearIndex_default_instance_.Shutdown();
  _SingleKdTreeIndex_default_instance_.Shutdown();
  _SquaredEuclideanDistance_default_instance_.Shutdown();
}